

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::PostResolutionChecks::checkPropertyValue(Expression *value)

{
  Statement *pSVar1;
  bool bVar2;
  uint uVar3;
  Constant *pCVar4;
  CompileMessage local_b0;
  undefined1 local_78 [8];
  Type type;
  pool_ptr<soul::AST::Constant> constValue;
  CompileMessage local_48;
  Expression *local_10;
  Expression *value_local;
  
  local_10 = value;
  uVar3 = (*(value->super_Statement).super_ASTObject._vptr_ASTObject[0xe])();
  if ((uVar3 & 1) == 0) {
    pSVar1 = &local_10->super_Statement;
    Errors::propertyMustBeConstant<>();
    AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_48,false);
  }
  (*(local_10->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&type.structure);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&type.structure);
  if (bVar2) {
    pCVar4 = pool_ptr<soul::AST::Constant>::operator->
                       ((pool_ptr<soul::AST::Constant> *)&type.structure);
    (*(pCVar4->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(local_78);
    bVar2 = Type::isPrimitiveFloat((Type *)local_78);
    if ((((!bVar2) && (bVar2 = Type::isPrimitiveInteger((Type *)local_78), !bVar2)) &&
        (bVar2 = Type::isPrimitiveBool((Type *)local_78), !bVar2)) &&
       (bVar2 = Type::isStringLiteral((Type *)local_78), !bVar2)) {
      pSVar1 = &local_10->super_Statement;
      Errors::illegalPropertyType<>();
      AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_b0,false);
    }
    Type::~Type((Type *)local_78);
  }
  pool_ptr<soul::AST::Constant>::~pool_ptr((pool_ptr<soul::AST::Constant> *)&type.structure);
  return;
}

Assistant:

static void checkPropertyValue (AST::Expression& value)
        {
            if (! value.isCompileTimeConstant())
                value.context.throwError (Errors::propertyMustBeConstant());

            if (auto constValue = value.getAsConstant())
            {
                auto type = constValue->getResultType();

                if (! (type.isPrimitiveFloat() || type.isPrimitiveInteger()
                        || type.isPrimitiveBool() || type.isStringLiteral()))
                    value.context.throwError (Errors::illegalPropertyType());
            }
        }